

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_28c34e::SndioCapture::recordProc(SndioCapture *this)

{
  ALCdevice *pAVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ll_ringbuffer_data_pair data;
  ll_ringbuffer_data_pair local_58;
  
  SetRTPriority();
  althrd_setname("alsoft-record");
  pAVar1 = (this->super_BackendBase).mDevice;
  uVar3 = BytesFromDevFmt(pAVar1->FmtType);
  uVar4 = ChannelsFromDevFmt(pAVar1->FmtChans,pAVar1->mAmbiOrder);
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    uVar10 = CONCAT44(0,uVar4 * uVar3);
    do {
      if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
        return 0;
      }
      RingBuffer::getWriteVector
                (&local_58,
                 (this->mRing)._M_t.
                 super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                 super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                 super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl);
      uVar5 = local_58.second.len + local_58.first.len;
      if (uVar5 == 0) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar10;
        uVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / auVar2,0);
        uVar5 = (ulong)((this->super_BackendBase).mDevice)->UpdateSize;
        if (uVar8 < uVar5) {
          uVar5 = uVar8;
        }
        sio_read(this->mSndHandle,recordProc::junk,uVar5 * uVar10);
      }
      else {
        local_58.first.len = local_58.first.len * uVar10;
        local_58.second.len = local_58.second.len * uVar10;
        uVar8 = (ulong)((this->super_BackendBase).mDevice)->UpdateSize;
        if (uVar5 < uVar8) {
          uVar8 = uVar5;
        }
        for (uVar5 = 0; uVar6 = uVar8 * uVar10 - uVar5, uVar5 <= uVar8 * uVar10 && uVar6 != 0;
            uVar5 = uVar5 + lVar7) {
          if (local_58.first.len == 0) {
            local_58.first.buf =
                 (byte *)CONCAT44(local_58.second.buf._4_4_,local_58.second.buf._0_4_);
            local_58.first.len = local_58.second.len;
          }
          sVar9 = local_58.first.len;
          if (uVar6 < local_58.first.len) {
            sVar9 = uVar6;
          }
          lVar7 = sio_read(this->mSndHandle,local_58.first.buf,sVar9);
          if (lVar7 == 0) {
            ALCdevice::handleDisconnect
                      ((this->super_BackendBase).mDevice,"Failed to read capture samples");
            break;
          }
          local_58.first.buf = local_58.first.buf + lVar7;
          local_58.first.len = local_58.first.len - lVar7;
        }
        RingBuffer::writeAdvance
                  ((this->mRing)._M_t.
                   super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                   super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                   super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl,uVar5 / uVar10);
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int SndioCapture::recordProc()
{
    SetRTPriority();
    althrd_setname(RECORD_THREAD_NAME);

    const ALuint frameSize{mDevice->frameSizeFromFmt()};

    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        auto data = mRing->getWriteVector();
        size_t todo{data.first.len + data.second.len};
        if(todo == 0)
        {
            static char junk[4096];
            sio_read(mSndHandle, junk,
                minz(sizeof(junk)/frameSize, mDevice->UpdateSize)*frameSize);
            continue;
        }

        size_t total{0u};
        data.first.len  *= frameSize;
        data.second.len *= frameSize;
        todo = minz(todo, mDevice->UpdateSize) * frameSize;
        while(total < todo)
        {
            if(!data.first.len)
                data.first = data.second;

            size_t got{sio_read(mSndHandle, data.first.buf, minz(todo-total, data.first.len))};
            if(!got)
            {
                mDevice->handleDisconnect("Failed to read capture samples");
                break;
            }

            data.first.buf += got;
            data.first.len -= got;
            total += got;
        }
        mRing->writeAdvance(total / frameSize);
    }

    return 0;
}